

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<char>::emplaceRealloc<char_const&>
          (SmallVectorBase<char> *this,pointer pos,char *args)

{
  ulong uVar1;
  pointer __dest;
  pointer __n;
  pointer __src;
  pointer __dest_00;
  long lVar2;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar2 = (long)pos - (long)this->data_;
  __dest = (pointer)detail::allocArray(capacity,1);
  __dest[lVar2] = *args;
  __src = this->data_;
  __n = (pointer)this->len;
  if (__src + (long)__n == pos) {
    __dest_00 = __dest;
    if (__n == (pointer)0x0) goto LAB_001909fd;
  }
  else {
    if (__src != pos) {
      memmove(__dest,__src,(long)pos - (long)__src);
      __src = this->data_;
      __n = (pointer)this->len;
    }
    __n = __src + ((long)__n - (long)pos);
    if (__n == (pointer)0x0) goto LAB_001909fd;
    __src = pos;
    __dest_00 = __dest + lVar2 + 1;
  }
  memmove(__dest_00,__src,(size_t)__n);
LAB_001909fd:
  if (this->data_ != this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __dest;
  return __dest + lVar2;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}